

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>::format
          (source_linenum_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  uint uVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  ptrdiff_t _Num;
  size_t __n;
  ulong uVar5;
  scoped_padder p;
  format_int fStack_78;
  scoped_padder local_58;
  
  if ((msg->source).line != 0) {
    uVar1 = (msg->source).line;
    uVar3 = uVar1 | 1;
    uVar4 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = (uVar4 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
    scoped_padder::scoped_padder
              (&local_58,
               (ulong)((uVar4 + 1) -
                      (uint)(uVar1 < *(uint *)(fmt::v6::internal::basic_data<void>::
                                               zero_or_powers_of_10_32 + (ulong)uVar4 * 4))),
               &(this->super_flag_formatter).padinfo_,dest);
    uVar1 = (msg->source).line;
    uVar4 = -uVar1;
    if (0 < (int)uVar1) {
      uVar4 = uVar1;
    }
    pcVar2 = fmt::v6::format_int::format_decimal(&fStack_78,(ulong)uVar4);
    fStack_78.str_ = pcVar2;
    if ((int)uVar1 < 0) {
      fStack_78.str_ = pcVar2 + -1;
      pcVar2[-1] = '-';
    }
    pcVar2 = fStack_78.str_;
    __n = (long)(fStack_78.buffer_ + 0x15) - (long)fStack_78.str_;
    uVar5 = (dest->super_buffer<char>).size_ + __n;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar5);
    }
    if (fStack_78.buffer_ + 0x15 != pcVar2) {
      memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,pcVar2,__n);
    }
    (dest->super_buffer<char>).size_ = uVar5;
    scoped_padder::~scoped_padder(&local_58);
  }
  return;
}

Assistant:

explicit B_formatter(padding_info padinfo)
        : flag_formatter(padinfo)
    {}